

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_IffExprPrecedence_Test::~ExprWriterTest_IffExprPrecedence_Test
          (ExprWriterTest_IffExprPrecedence_Test *this)

{
  void *in_RDI;
  
  ~ExprWriterTest_IffExprPrecedence_Test((ExprWriterTest_IffExprPrecedence_Test *)0x1353c8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, IffExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 <==> 1 <==> 1 then 1",
      MakeIf(MakeBinaryLogical(ex::IFF, MakeBinaryLogical(ex::IFF, l0, l1), l1),
          n1, n0));
  CHECK_WRITE("if 0 <==> (1 <==> 1) then 1",
      MakeIf(MakeBinaryLogical(ex::IFF, l0, MakeBinaryLogical(ex::IFF, l1, l1)),
          n1, n0));
  CHECK_WRITE("if (0 <==> 1) && 1 then 1",
      MakeIf(MakeBinaryLogical(ex::AND, MakeBinaryLogical(ex::IFF, l0, l1), l1),
          n1, n0));
}